

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::get_vertex_attribiv(NegativeTestContext *ctx)

{
  allocator<char> local_3d;
  GLint params;
  string local_38;
  GLint maxVertexAttribs;
  
  params = -1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"GL_INVALID_ENUM is generated if pname is not an accepted value.",
             &local_3d);
  NegativeTestContext::beginSection(ctx,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  glu::CallLogWrapper::glGetVertexAttribiv(&ctx->super_CallLogWrapper,0,0xffffffff,&params);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_VALUE is generated if index is greater than or equal to GL_MAX_VERTEX_ATTRIBS."
             ,&local_3d);
  NegativeTestContext::beginSection(ctx,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  glu::CallLogWrapper::glGetIntegerv(&ctx->super_CallLogWrapper,0x8869,&maxVertexAttribs);
  glu::CallLogWrapper::glGetVertexAttribiv
            (&ctx->super_CallLogWrapper,maxVertexAttribs,0x8622,&params);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void get_vertex_attribiv (NegativeTestContext& ctx)
{
	GLint	params				= -1;
	GLint	maxVertexAttribs;

	ctx.beginSection("GL_INVALID_ENUM is generated if pname is not an accepted value.");
	ctx.glGetVertexAttribiv(0, -1, &params);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if index is greater than or equal to GL_MAX_VERTEX_ATTRIBS.");
	ctx.glGetIntegerv(GL_MAX_VERTEX_ATTRIBS, &maxVertexAttribs);
	ctx.glGetVertexAttribiv(maxVertexAttribs, GL_VERTEX_ATTRIB_ARRAY_ENABLED, &params);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();
}